

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Gia_ManCountCareBits(Gia_Man_t *p,Vec_Wec_t *vPats)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_44;
  int Count;
  Vec_Int_t *vPat;
  word Counter;
  int fCompl1;
  int fCompl0;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Wec_t *vPats_local;
  Gia_Man_t *p_local;
  
  vPat = (Vec_Int_t *)0x0;
  fCompl0 = 0;
  while( true ) {
    iVar3 = Vec_WecSize(vPats);
    if (iVar3 <= fCompl0) {
      iVar3 = Vec_WecSize(vPats);
      uVar5 = Vec_WecSize(vPats);
      iVar6 = Gia_ManAndNum(p);
      printf("Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n",
             ((double)(int)((ulong)vPat / (ulong)(long)iVar3) * 100.0) / (double)iVar6,(ulong)uVar5,
             (ulong)vPat / (ulong)(long)iVar3 & 0xffffffff);
      return;
    }
    p_00 = Vec_WecEntry(vPats,fCompl0);
    local_44 = 0;
    iVar3 = Vec_IntSize(p_00);
    iVar6 = Gia_ManCiNum(p);
    if (iVar3 != iVar6) break;
    pGVar7 = Gia_ManConst0(p);
    *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
    pGVar7 = Gia_ManConst0(p);
    *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff;
    fCompl1 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (fCompl1 < iVar3) {
        _k = Gia_ManCi(p,fCompl1);
        bVar8 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar5 = Vec_IntEntry(p_00,fCompl1);
      *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff;
      fCompl1 = fCompl1 + 1;
    }
    fCompl1 = 0;
    while( true ) {
      bVar8 = false;
      if (fCompl1 < p->nObjs) {
        _k = Gia_ManObj(p,fCompl1);
        bVar8 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(_k);
      if (iVar3 != 0) {
        pGVar7 = Gia_ObjFanin0(_k);
        uVar2 = *(ulong *)pGVar7;
        uVar5 = Gia_ObjFaninC0(_k);
        pGVar7 = Gia_ObjFanin1(_k);
        uVar1 = *(ulong *)pGVar7;
        uVar4 = Gia_ObjFaninC1(_k);
        *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff |
                       ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) &
                               ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1) << 0x1e;
        *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff;
      }
      fCompl1 = fCompl1 + 1;
    }
    fCompl1 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (fCompl1 < iVar3) {
        _k = Gia_ManCo(p,fCompl1);
        bVar8 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      pGVar7 = Gia_ObjFanin0(_k);
      uVar2 = *(ulong *)pGVar7;
      uVar5 = Gia_ObjFaninC0(_k);
      *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff |
                     ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      pGVar7 = Gia_ObjFanin0(_k);
      *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
      fCompl1 = fCompl1 + 1;
    }
    fCompl1 = p->nObjs;
    while( true ) {
      fCompl1 = fCompl1 + -1;
      bVar8 = false;
      if (0 < fCompl1) {
        _k = Gia_ManObj(p,fCompl1);
        bVar8 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(_k);
      if ((iVar3 != 0) && ((*(ulong *)_k >> 0x3e & 1) != 0)) {
        if ((*(ulong *)_k >> 0x1e & 1) == 0) {
          pGVar7 = Gia_ObjFanin0(_k);
          uVar2 = *(ulong *)pGVar7;
          uVar5 = Gia_ObjFaninC0(_k);
          uVar5 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar5;
          pGVar7 = Gia_ObjFanin1(_k);
          uVar2 = *(ulong *)pGVar7;
          uVar4 = Gia_ObjFaninC1(_k);
          uVar4 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar4;
          if ((uVar5 != 0) && (uVar4 != 0)) {
            __assert_fail("fCompl0 == 0 || fCompl1 == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                          ,899,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
          }
          if (uVar4 == 0) {
            pGVar7 = Gia_ObjFanin1(_k);
            *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
          }
          else if (uVar5 == 0) {
            pGVar7 = Gia_ObjFanin0(_k);
            *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
          }
        }
        else {
          pGVar7 = Gia_ObjFanin0(_k);
          *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
          pGVar7 = Gia_ObjFanin1(_k);
          *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
        }
      }
    }
    fCompl1 = 0;
    while( true ) {
      bVar8 = false;
      if (fCompl1 < p->nObjs) {
        _k = Gia_ManObj(p,fCompl1);
        bVar8 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(_k);
      if (iVar3 != 0) {
        local_44 = ((uint)((ulong)*(undefined8 *)_k >> 0x3e) & 1) + local_44;
      }
      fCompl1 = fCompl1 + 1;
    }
    vPat = (Vec_Int_t *)((long)&vPat->nCap + (long)local_44);
    fCompl0 = fCompl0 + 1;
  }
  __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                ,0x364,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
}

Assistant:

void Gia_ManCountCareBits( Gia_Man_t * p, Vec_Wec_t * vPats )
{
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    word Counter = 0;
    Vec_Int_t * vPat;
    Vec_WecForEachLevel( vPats, vPat, i )
    {
        int Count = 0;
        assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );

        // propagate forward
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManConst0(p)->fMark1 = 0;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Vec_IntEntry(vPat, k);
            pObj->fMark1 = 0;
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            pObj->fMark1 = 0;
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ObjFanin0(pObj)->fMark1 = 1;
        }
        // propagate backward
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark1 )
                continue;
            if ( pObj->fMark0 == 0 )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                assert( fCompl0 == 0 || fCompl1 == 0 );
                if ( fCompl1 == 0 )
                    Gia_ObjFanin1(pObj)->fMark1 = 1;
                else if ( fCompl0 == 0 )
                    Gia_ObjFanin0(pObj)->fMark1 = 1;
                
            }
            else
            {
                Gia_ObjFanin0(pObj)->fMark1 = 1;
                Gia_ObjFanin1(pObj)->fMark1 = 1;
            }
        }
        Gia_ManForEachAnd( p, pObj, k )
            Count += pObj->fMark1;
        Counter += Count;

        //printf( "%3d = %8d\n", i, Count );
    }
    Counter /= Vec_WecSize(vPats);
    printf( "Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n", Vec_WecSize(vPats), (int)Counter, 100.0*(int)Counter/Gia_ManAndNum(p) );
}